

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Graph *l2h,Read<signed_char> *high_marked)

{
  Alloc *pAVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  Alloc *pAVar6;
  void *pvVar7;
  Alloc *this_00;
  Alloc *pAVar8;
  Alloc *pAVar9;
  Alloc *pAVar10;
  ulong **__dest;
  long *plVar11;
  long lVar12;
  ulong *puVar13;
  long lVar14;
  int iVar15;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar16;
  ulong uVar17;
  size_t sVar18;
  bool bVar19;
  bool bVar20;
  Read<signed_char> RVar21;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> low_marks_w;
  size_type __dnew;
  type f;
  LOs lh2h;
  LOs l2lh;
  ScopedTimer local_199;
  undefined1 local_198 [32];
  Alloc *local_178;
  void *local_170;
  Alloc *local_168;
  void *local_160;
  Write<signed_char> local_158;
  Alloc *local_148;
  int local_13c;
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  Write<signed_char> local_118;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  ulong **local_e8;
  ulong *local_e0;
  ulong *local_d8 [2];
  Alloc *local_c8;
  void *pvStack_c0;
  Alloc *local_b8;
  void *pvStack_b0;
  Alloc *local_a8;
  void *pvStack_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  Alloc *local_80;
  Alloc *local_78;
  Alloc *local_70;
  Alloc *local_68;
  ulong local_60;
  Alloc *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_40 = (l2h->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  pAVar10 = local_40;
  pvVar16 = (l2h->a2ab).write_.shared_alloc_.direct_ptr;
  local_50 = (l2h->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  pAVar9 = local_50;
  pvVar4 = (l2h->ab2b).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_40 & 1) == 0) {
    sVar18 = local_40->size;
  }
  else {
    sVar18 = (ulong)local_40 >> 3;
  }
  local_198._0_8_ = local_198 + 0x10;
  local_58 = (Alloc *)this;
  local_48 = pvVar4;
  local_38 = pvVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
  local_60 = sVar18 >> 2;
  local_13c = (int)local_60 + -1;
  Write<signed_char>::Write(&local_158,local_13c,'\0',(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  pvVar7 = local_158.shared_alloc_.direct_ptr;
  bVar19 = ((ulong)pAVar10 & 7) == 0;
  local_c8 = pAVar10;
  if (bVar19 && pAVar10 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(pAVar10->size * 8 + 1);
    }
    else {
      pAVar10->use_count = pAVar10->use_count + 1;
    }
  }
  local_b8 = (high_marked->write_).shared_alloc_.alloc;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  pvVar5 = (high_marked->write_).shared_alloc_.direct_ptr;
  bVar20 = ((ulong)pAVar9 & 7) == 0;
  local_a8 = pAVar9;
  if (bVar20 && pAVar9 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(pAVar9->size * 8 + 1);
    }
    else {
      pAVar9->use_count = pAVar9->use_count + 1;
    }
  }
  local_98 = local_158.shared_alloc_.alloc;
  if (((ulong)local_158.shared_alloc_.alloc & 7) == 0 &&
      local_158.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)((local_158.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_158.shared_alloc_.alloc)->use_count = (local_158.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_90 = local_158.shared_alloc_.direct_ptr;
  local_e8 = local_d8;
  local_138 = (ulong *)0x5d;
  local_148 = local_98;
  pvStack_c0 = pvVar16;
  pvStack_b0 = pvVar5;
  pvStack_a0 = pvVar4;
  local_88 = local_a8;
  local_80 = local_c8;
  local_78 = local_b8;
  local_70 = pAVar9;
  local_68 = pAVar10;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_138);
  puVar13 = local_138;
  local_d8[0] = local_138;
  local_e8 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_e0 = puVar13;
  *(undefined1 *)((long)__dest + (long)puVar13) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_e8);
  puVar13 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar13) {
    local_f8 = *puVar13;
    lStack_f0 = plVar11[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar13;
    local_108 = (ulong *)*plVar11;
  }
  local_100 = plVar11[1];
  *plVar11 = (long)puVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x02');
  *(undefined2 *)local_138 = 0x3438;
  uVar17 = 0xf;
  if (local_108 != &local_f8) {
    uVar17 = local_f8;
  }
  if (uVar17 < (ulong)(local_130 + local_100)) {
    uVar17 = 0xf;
    if (local_138 != local_128) {
      uVar17 = local_128[0];
    }
    if ((ulong)(local_130 + local_100) <= uVar17) {
      plVar11 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_138,0,(char *)0x0,(ulong)local_108);
      goto LAB_00311666;
    }
  }
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_138);
LAB_00311666:
  local_198._0_8_ = local_198 + 0x10;
  pAVar1 = (Alloc *)(plVar11 + 2);
  if ((Alloc *)*plVar11 == pAVar1) {
    local_198._16_8_ = pAVar1->size;
    local_198._24_8_ = plVar11[3];
  }
  else {
    local_198._16_8_ = pAVar1->size;
    local_198._0_8_ = (Alloc *)*plVar11;
  }
  local_198._8_8_ = plVar11[1];
  *plVar11 = (long)pAVar1;
  plVar11[1] = 0;
  *(undefined1 *)&pAVar1->size = 0;
  begin_code("parallel_for",(char *)local_198._0_8_);
  if ((Alloc *)local_198._0_8_ != (Alloc *)(local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  pAVar1 = local_68;
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,(long)local_d8[0] + 1);
  }
  if (1 < (int)local_60) {
    local_198._0_8_ = local_80;
    if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
      local_80->use_count = local_80->use_count + -1;
      local_198._0_8_ = local_80->size * 8 + 1;
    }
    local_c8 = (Alloc *)0x0;
    pvStack_c0 = (void *)0x0;
    local_198._16_8_ = local_78;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_198._16_8_ = local_78->size * 8 + 1;
    }
    local_b8 = (Alloc *)0x0;
    pvStack_b0 = (void *)0x0;
    local_178 = local_88;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_178 = (Alloc *)(local_88->size * 8 + 1);
    }
    local_a8 = (Alloc *)0x0;
    pvStack_a0 = (void *)0x0;
    local_168 = local_148;
    local_160 = pvVar7;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      local_148->use_count = local_148->use_count + -1;
      local_168 = (Alloc *)(local_148->size * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      iVar3 = *(int *)((long)pvVar16 + lVar12 * 4);
      lVar14 = (long)iVar3;
      iVar15 = *(int *)((long)pvVar16 + lVar12 * 4 + 4);
      if (iVar3 < iVar15) {
        do {
          if (*(char *)((long)pvVar5 + (long)*(int *)((long)pvVar4 + lVar14 * 4)) != '\0') {
            *(undefined1 *)((long)pvVar7 + lVar12) = 1;
            iVar15 = *(int *)((long)pvVar16 + lVar12 * 4 + 4);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar15);
      }
      lVar12 = lVar12 + 1;
    } while (local_13c != (int)lVar12);
    local_198._8_8_ = pvVar16;
    local_198._24_8_ = pvVar5;
    local_170 = pvVar4;
    mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_198);
  }
  ScopedTimer::~ScopedTimer(&local_199);
  pAVar8 = local_58;
  local_118.shared_alloc_.alloc = local_158.shared_alloc_.alloc;
  local_118.shared_alloc_.direct_ptr = local_158.shared_alloc_.direct_ptr;
  if ((((ulong)local_158.shared_alloc_.alloc & 7) == 0 &&
       local_158.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_158.shared_alloc_.alloc)->use_count = (local_158.shared_alloc_.alloc)->use_count + -1;
    local_118.shared_alloc_.alloc = (Alloc *)((local_158.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_158.shared_alloc_.alloc = (Alloc *)0x0;
  local_158.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)local_58,&local_118);
  this_00 = local_70;
  pAVar6 = local_118.shared_alloc_.alloc;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_118.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_118.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  mark_down(Omega_h::Graph,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_c8);
  pAVar6 = local_158.shared_alloc_.alloc;
  pvVar16 = extraout_RDX;
  if (((ulong)local_158.shared_alloc_.alloc & 7) == 0 &&
      local_158.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_158.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_158.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
      pvVar16 = extraout_RDX_00;
    }
  }
  if (bVar20 && pAVar9 != (Alloc *)0x0) {
    piVar2 = &this_00->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar16 = extraout_RDX_01;
    }
  }
  if (bVar19 && pAVar10 != (Alloc *)0x0) {
    piVar2 = &pAVar1->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar1);
      operator_delete(pAVar1,0x48);
      pvVar16 = extraout_RDX_02;
    }
  }
  RVar21.write_.shared_alloc_.direct_ptr = pvVar16;
  RVar21.write_.shared_alloc_.alloc = pAVar8;
  return (Read<signed_char>)RVar21.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_down(Graph l2h, Read<I8> high_marked) {
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto nl = l2lh.size() - 1;
  Write<I8> low_marks_w(nl, 0);
  auto f = OMEGA_H_LAMBDA(LO l) {
    for (LO lh = l2lh[l]; lh < l2lh[l + 1]; ++lh)
      if (high_marked[lh2h[lh]]) low_marks_w[l] = 1;
  };
  parallel_for(nl, std::move(f));
  return low_marks_w;
}